

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

GLValue deqp::gls::GLValue::getMaxValue(InputType type)

{
  Half value;
  GLValue GVar1;
  GLValue *local_1e0;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_1d0;
  GLValue GStack_1c8;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_1b8;
  GLValue GStack_1b0;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_1a0;
  GLValue GStack_198;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_188;
  GLValue GStack_180;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_170;
  GLValue GStack_168;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_158;
  GLValue GStack_150;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_140;
  GLValue GStack_138;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_128;
  GLValue GStack_120;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_110;
  undefined1 auStack_108 [16];
  GLValue local_f8;
  undefined1 auStack_e8 [8];
  GLValue rangesHi [12];
  InputType type_local;
  
  local_1e0 = (GLValue *)auStack_e8;
  do {
    GLValue(local_1e0);
    local_1e0 = local_1e0 + 1;
  } while (local_1e0 != (GLValue *)&rangesHi[0xb].field_1);
  auStack_108._12_4_ = WrappedFloatType<float>::create(127.0);
  GLValue(&local_f8,(Float)auStack_108._12_4_);
  auStack_e8 = (undefined1  [8])local_f8._0_8_;
  rangesHi[0]._0_8_ = local_f8.field_1;
  GStack_120.field_1.d.m_value = WrappedFloatType<double>::create(127.0);
  GLValue((GLValue *)&local_110.fl,GStack_120.field_1.d.m_value);
  rangesHi[1].field_1 = local_110;
  rangesHi[2]._0_8_ = auStack_108._0_8_;
  GStack_138.field_1._7_1_ = WrappedType<signed_char>::create('\x7f');
  GLValue((GLValue *)&local_128.fl,(Byte)GStack_138.field_1._7_1_);
  rangesHi[2].field_1 = local_128;
  rangesHi[3].type = GStack_120.type;
  rangesHi[3]._4_4_ = GStack_120._4_4_;
  GStack_150.field_1._7_1_ = WrappedType<unsigned_char>::create(0xff);
  GLValue((GLValue *)&local_140.fl,(Ubyte)GStack_150.field_1._7_1_);
  rangesHi[4].field_1 = local_140;
  rangesHi[5].type = GStack_138.type;
  rangesHi[5]._4_4_ = GStack_138._4_4_;
  GStack_168.field_1._6_2_ = WrappedType<unsigned_short>::create(0xfffa);
  GLValue((GLValue *)&local_158.fl,(Ushort)GStack_168.field_1._6_2_);
  rangesHi[5].field_1 = local_158;
  rangesHi[6].type = GStack_150.type;
  rangesHi[6]._4_4_ = GStack_150._4_4_;
  GStack_180.field_1._6_2_ = WrappedType<short>::create(0x7ff8);
  GLValue((GLValue *)&local_170.fl,(Short)GStack_180.field_1._6_2_);
  rangesHi[3].field_1 = local_170;
  rangesHi[4].type = GStack_168.type;
  rangesHi[4]._4_4_ = GStack_168._4_4_;
  GStack_198.field_1._4_4_ = Fixed::create(0x7ff8);
  GLValue((GLValue *)&local_188.fl,(Fixed)GStack_198.field_1._4_4_);
  rangesHi[0].field_1 = local_188;
  rangesHi[1].type = GStack_180.type;
  rangesHi[1]._4_4_ = GStack_180._4_4_;
  GStack_1b0.field_1._4_4_ = WrappedType<int>::create(0x7fffffff);
  GLValue((GLValue *)&local_1a0.fl,(Int)GStack_1b0.field_1._4_4_);
  rangesHi[6].field_1 = local_1a0;
  rangesHi[7].type = GStack_198.type;
  rangesHi[7]._4_4_ = GStack_198._4_4_;
  GStack_1c8.field_1._4_4_ = WrappedType<unsigned_int>::create(0xffffffff);
  GLValue((GLValue *)&local_1b8.fl,(Uint)GStack_1c8.field_1._4_4_);
  rangesHi[7].field_1 = local_1b8;
  rangesHi[8].type = GStack_1b0.type;
  rangesHi[8]._4_4_ = GStack_1b0._4_4_;
  value = Half::create(256.0);
  GLValue((GLValue *)&local_1d0.fl,value);
  rangesHi[8].field_1 = local_1d0;
  rangesHi[9].type = GStack_1c8.type;
  rangesHi[9]._4_4_ = GStack_1c8._4_4_;
  GVar1._0_8_ = (ulong)rangesHi[(long)(int)type + -1].field_1 & 0xffffffff;
  GVar1.field_1 = *(anon_union_8_10_1f5805e9_for_GLValue_1 *)(rangesHi + (int)type);
  return GVar1;
}

Assistant:

GLValue GLValue::getMaxValue (Array::InputType type)
{
	GLValue rangesHi[(int)Array::INPUTTYPE_LAST];

	rangesHi[(int)Array::INPUTTYPE_FLOAT]			= GLValue(Float::create(127.0f));
	rangesHi[(int)Array::INPUTTYPE_DOUBLE]			= GLValue(Double::create(127.0f));
	rangesHi[(int)Array::INPUTTYPE_BYTE]			= GLValue(Byte::create(127));
	rangesHi[(int)Array::INPUTTYPE_UNSIGNED_BYTE]	= GLValue(Ubyte::create(255));
	rangesHi[(int)Array::INPUTTYPE_UNSIGNED_SHORT]	= GLValue(Ushort::create(65530));
	rangesHi[(int)Array::INPUTTYPE_SHORT]			= GLValue(Short::create(32760));
	rangesHi[(int)Array::INPUTTYPE_FIXED]			= GLValue(Fixed::create(32760));
	rangesHi[(int)Array::INPUTTYPE_INT]				= GLValue(Int::create(2147483647));
	rangesHi[(int)Array::INPUTTYPE_UNSIGNED_INT]	= GLValue(Uint::create(4294967295u));
	rangesHi[(int)Array::INPUTTYPE_HALF]			= GLValue(Half::create(256.0f));

	return rangesHi[(int)type];
}